

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O2

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  Value *in_RAX;
  long *plVar1;
  undefined4 in_register_00000034;
  long *plVar2;
  
  plVar1 = (long *)(CONCAT44(in_register_00000034,__fd) + 0x48);
  plVar2 = plVar1;
  while (plVar2 = (long *)*plVar2, plVar2 != plVar1) {
    in_RAX = codegen(this,(Stmt *)plVar2[2]);
  }
  return (int)in_RAX;
}

Assistant:

void IRGenerator::accept(CompoundStmt& compoundStmt) {
  for (const auto& stmt : compoundStmt) {
    codegen(stmt.get());
  }
}